

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O0

Result __thiscall Kernel::LPO::cMA(LPO *this,AppliedTerm s,AppliedTerm t,TermList *tl,uint arity)

{
  AppliedTerm parent;
  AppliedTerm s_00;
  AppliedTerm t_00;
  Result RVar1;
  uint in_EDX;
  SubstApplicator *in_RSI;
  SubstApplicator *in_RDI;
  LPO *in_stack_00000018;
  undefined1 in_stack_00000030 [24];
  AppliedTerm in_stack_00000048;
  uint i;
  AppliedTerm *in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  undefined1 *puVar2;
  undefined8 *puVar3;
  uint arity_00;
  TermList *in_stack_ffffffffffffffa0;
  LPO *this_00;
  AppliedTerm *pAStack_48;
  uint64_t in_stack_ffffffffffffffc0;
  undefined8 uVar4;
  SubstApplicator *pSVar5;
  undefined8 uVar6;
  uint uVar7;
  
  puVar2 = &stack0x00000020;
  puVar3 = (undefined8 *)&stack0x00000008;
  uVar7 = 0;
  while( true ) {
    if (in_EDX <= uVar7) {
      return GREATER;
    }
    uVar6 = puVar3[2];
    uVar4 = *puVar3;
    pSVar5 = (SubstApplicator *)puVar3[1];
    this_00 = (LPO *)in_RSI[-(ulong)uVar7]._vptr_SubstApplicator;
    arity_00 = (uint)((ulong)*(undefined8 *)(puVar2 + 0x10) >> 0x20);
    parent._8_8_ = puVar3;
    parent.term._content = (uint64_t)puVar2;
    parent.applicator = in_RDI;
    AppliedTerm::AppliedTerm(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,parent);
    in_stack_ffffffffffffff30._content = in_stack_ffffffffffffffc0;
    in_stack_ffffffffffffff28 = pAStack_48;
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff30._content;
    RVar1 = clpo(in_stack_00000018,(AppliedTerm)in_stack_00000030,in_stack_00000048);
    if (RVar1 != GREATER) break;
    uVar7 = uVar7 + 1;
  }
  if (1 < RVar1 - LESS) {
    s_00._8_8_ = uVar4;
    s_00.term._content = in_stack_ffffffffffffffc0;
    s_00.applicator = pSVar5;
    t_00._8_4_ = uVar7;
    t_00.term._content = uVar6;
    t_00._12_4_ = in_EDX;
    t_00.applicator = in_RSI;
    RVar1 = alpha(this_00,in_stack_ffffffffffffffa0,arity_00,s_00,t_00);
    RVar1 = Ordering::reverse(RVar1);
    return RVar1;
  }
  return LESS;
}

Assistant:

Ordering::Result LPO::cMA(AppliedTerm s, AppliedTerm t, const TermList* tl, unsigned arity) const
{
  for (unsigned i = 0; i < arity; i++) {
    switch(clpo(s, AppliedTerm(*(tl - i),t))) {
    case EQUAL:
    case LESS:
      return LESS;
    case INCOMPARABLE:
      return reverse(alpha(tl - i - 1, arity - i - 1, t, s));
    case GREATER:
      break;
    default:
      ASSERTION_VIOLATION;
    }
  }
  return GREATER;
}